

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O0

void TasGrid::constructCommon<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,
               function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>
               *candidates,string *checkpoint_filename)

{
  allocator<double> *this;
  pointer *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *puVar4;
  unsigned_long dimensions;
  ulong uVar5;
  runtime_error *this_01;
  size_t sVar6;
  size_type sVar7;
  size_t sVar8;
  void *__buf;
  void *__buf_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<double,_std::allocator<double>_> local_870;
  vector<double,_std::allocator<double>_> local_858;
  allocator<double> local_839;
  undefined1 local_838 [8];
  vector<double,_std::allocator<double>_> y;
  undefined1 local_818 [8];
  vector<double,_std::allocator<double>_> x;
  anon_class_24_3_1d86c3a8 set_initial_guess;
  anon_class_32_4_d8093f07 checkout_sample;
  size_t total_num_launched;
  anon_class_32_4_2882b012 refresh_candidates;
  anon_class_16_2_592c7d46 load_complete;
  anon_class_24_3_de235a21 checkpoint;
  ofstream ofs;
  runtime_error *anon_var_0_1;
  ifstream oldfile;
  runtime_error *anon_var_0;
  ifstream infile;
  undefined1 local_158 [8];
  string filename_old;
  string filename;
  undefined1 local_108 [8];
  CompleteStorage complete;
  CandidateManager manager;
  size_t num_outputs;
  size_t num_dimensions;
  unsigned_long local_40;
  function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)> *local_38;
  function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>
  *candidates_local;
  TasmanianSparseGrid *grid_local;
  size_t max_samples_per_job_local;
  size_t num_parallel_jobs_local;
  size_t max_num_points_local;
  ModelSignature *model_local;
  
  local_40 = 1;
  local_38 = candidates;
  candidates_local =
       (function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)> *)
       grid;
  grid_local = (TasmanianSparseGrid *)max_samples_per_job;
  max_samples_per_job_local = num_parallel_jobs;
  num_parallel_jobs_local = max_num_points;
  max_num_points_local = (size_t)model;
  puVar4 = std::max<unsigned_long>(&local_40,&max_samples_per_job_local);
  max_samples_per_job_local = *puVar4;
  num_dimensions = 1;
  puVar4 = std::max<unsigned_long>(&num_dimensions,(unsigned_long *)&grid_local);
  grid_local = (TasmanianSparseGrid *)*puVar4;
  iVar3 = TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)candidates_local);
  dimensions = (unsigned_long)iVar3;
  TasmanianSparseGrid::getNumOutputs((TasmanianSparseGrid *)candidates_local);
  CandidateManager::CandidateManager<unsigned_long,unsigned_long>
            ((CandidateManager *)
             &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,dimensions,(unsigned_long)grid_local);
  CompleteStorage::CompleteStorage<unsigned_long>((CompleteStorage *)local_108,dimensions);
  std::__cxx11::string::string
            ((string *)(filename_old.field_2._M_local_buf + 8),(string *)checkpoint_filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 checkpoint_filename,"_old");
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::ifstream::ifstream(&anon_var_0,(string *)(filename_old.field_2._M_local_buf + 8),_S_bin);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"missing main checkpoint");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TasGrid::TasmanianSparseGrid::read((istream *)candidates_local,SUB81(&anon_var_0,0));
    CompleteStorage::read((CompleteStorage *)local_108,(int)&anon_var_0,__buf,max_samples_per_job);
    std::ifstream::~ifstream(&anon_var_0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::ofstream::ofstream
              (&checkpoint.complete,(string *)(filename_old.field_2._M_local_buf + 8),_S_bin);
    TasGrid::TasmanianSparseGrid::write
              ((ostream *)candidates_local,(bool)((char)&checkpoint + '\x10'));
    CompleteStorage::write
              ((CompleteStorage *)local_108,(int)&checkpoint + 0x10,__buf_00,max_samples_per_job);
    std::ofstream::~ofstream(&checkpoint.complete);
  }
  load_complete.grid = (TasmanianSparseGrid *)((long)&filename_old.field_2 + 8);
  checkpoint.filename = (string *)candidates_local;
  refresh_candidates.grid = (TasmanianSparseGrid *)local_108;
  load_complete.complete = (CompleteStorage *)candidates_local;
  total_num_launched = (size_t)&refresh_candidates.grid;
  refresh_candidates.load_complete =
       (anon_class_16_2_592c7d46 *)
       &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  refresh_candidates.candidates = candidates_local;
  refresh_candidates.manager = (CandidateManager *)candidates;
  checkpoint.grid = refresh_candidates.grid;
  sVar6 = CompleteStorage::getNumStored((CompleteStorage *)refresh_candidates.grid);
  iVar3 = TasmanianSparseGrid::getNumLoaded((TasmanianSparseGrid *)candidates_local);
  checkout_sample.refresh_candidates = (anon_class_32_4_2882b012 *)(sVar6 + (long)iVar3);
  checkout_sample.manager = (CandidateManager *)&num_parallel_jobs_local;
  checkout_sample.max_num_points = (size_t *)&checkout_sample.refresh_candidates;
  checkout_sample.total_num_launched = &total_num_launched;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)candidates_local;
  bVar2 = TasmanianSparseGrid::isUsingConstruction((TasmanianSparseGrid *)candidates_local);
  if (!bVar2) {
    TasGrid::TasmanianSparseGrid::beginConstruction();
  }
  constructCommon<false,_false>::anon_class_32_4_2882b012::operator()
            ((anon_class_32_4_2882b012 *)&total_num_launched);
  iVar3 = TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)candidates_local);
  this = (allocator<double> *)
         ((long)&y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_818,(long)iVar3,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar3 = TasmanianSparseGrid::getNumOutputs((TasmanianSparseGrid *)candidates_local);
  std::allocator<double>::allocator(&local_839);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_838,(long)iVar3,&local_839);
  std::allocator<double>::~allocator(&local_839);
  do {
    bVar2 = false;
    if (checkout_sample.refresh_candidates < num_parallel_jobs_local) {
      sVar6 = CandidateManager::getNumCandidates
                        ((CandidateManager *)
                         &complete.values.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = sVar6 != 0;
    }
    if (!bVar2) {
      constructCommon<false,_false>::anon_class_16_2_592c7d46::operator()
                ((anon_class_16_2_592c7d46 *)&refresh_candidates.grid);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_838);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_818);
      std::__cxx11::string::~string((string *)local_158);
      std::__cxx11::string::~string((string *)(filename_old.field_2._M_local_buf + 8));
      CompleteStorage::~CompleteStorage((CompleteStorage *)local_108);
      CandidateManager::~CandidateManager
                ((CandidateManager *)
                 &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    CandidateManager::next
              (&local_858,
               (CandidateManager *)
               &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               num_parallel_jobs_local - (long)checkout_sample.refresh_candidates);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_818,&local_858);
    std::vector<double,_std::allocator<double>_>::~vector(&local_858);
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)local_818);
    if (bVar2) {
      constructCommon<false,_false>::anon_class_32_4_2882b012::operator()
                ((anon_class_32_4_2882b012 *)&total_num_launched);
      CandidateManager::next
                (&local_870,
                 (CandidateManager *)
                 &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 num_parallel_jobs_local - (long)checkout_sample.refresh_candidates);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_818,&local_870);
      std::vector<double,_std::allocator<double>_>::~vector(&local_870);
    }
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)local_818);
    if (!bVar2) {
      sVar7 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_818);
      checkout_sample.refresh_candidates =
           (anon_class_32_4_2882b012 *)
           ((long)&(checkout_sample.refresh_candidates)->load_complete + sVar7 / dimensions);
      constructCommon<false,_false>::anon_class_24_3_1d86c3a8::operator()
                ((anon_class_24_3_1d86c3a8 *)
                 &x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<double,_std::allocator<double>_> *)local_818,
                 (vector<double,_std::allocator<double>_> *)local_838);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
      ::operator()(model,(vector<double,_std::allocator<double>_> *)local_818,
                   (vector<double,_std::allocator<double>_> *)local_838,0);
      CompleteStorage::add
                ((CompleteStorage *)local_108,(vector<double,_std::allocator<double>_> *)local_818,
                 (vector<double,_std::allocator<double>_> *)local_838);
      CandidateManager::complete
                ((CandidateManager *)
                 &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<double,_std::allocator<double>_> *)local_818);
      iVar3 = TasmanianSparseGrid::getNumLoaded((TasmanianSparseGrid *)candidates_local);
      if (iVar3 < 1000) {
LAB_001481fc:
        constructCommon<false,_false>::anon_class_16_2_592c7d46::operator()
                  ((anon_class_16_2_592c7d46 *)&refresh_candidates.grid);
      }
      else {
        sVar6 = CompleteStorage::getNumStored((CompleteStorage *)local_108);
        auVar9._8_4_ = (int)(sVar6 >> 0x20);
        auVar9._0_8_ = sVar6;
        auVar9._12_4_ = 0x45300000;
        iVar3 = TasmanianSparseGrid::getNumLoaded((TasmanianSparseGrid *)candidates_local);
        if (0.2 < ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) / (double)iVar3)
        goto LAB_001481fc;
      }
      this_00 = &complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar6 = CandidateManager::getNumDone((CandidateManager *)this_00);
      auVar10._8_4_ = (int)(sVar6 >> 0x20);
      auVar10._0_8_ = sVar6;
      auVar10._12_4_ = 0x45300000;
      sVar8 = CandidateManager::getNumCandidates((CandidateManager *)this_00);
      auVar11._8_4_ = (int)(sVar8 >> 0x20);
      auVar11._0_8_ = sVar8;
      auVar11._12_4_ = 0x45300000;
      if (0.2 < ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) /
                ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0))) {
        constructCommon<false,_false>::anon_class_32_4_2882b012::operator()
                  ((anon_class_32_4_2882b012 *)&total_num_launched);
      }
    }
    constructCommon<false,_false>::anon_class_24_3_de235a21::operator()
              ((anon_class_24_3_de235a21 *)&load_complete.grid);
  } while( true );
}

Assistant:

void constructCommon(ModelSignature model,
                     size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                     TasmanianSparseGrid &grid,
                     std::function<std::vector<double>(TasmanianSparseGrid &)> candidates,
                     std::string const &checkpoint_filename){

    num_parallel_jobs   = std::max(size_t(1), num_parallel_jobs);
    max_samples_per_job = std::max(size_t(1), max_samples_per_job);
    size_t num_dimensions = (size_t) grid.getNumDimensions();
    size_t num_outputs    = (size_t) grid.getNumOutputs();
    CandidateManager manager(num_dimensions, max_samples_per_job); // keeps track of started and ordered samples
    CompleteStorage complete(num_dimensions); // temporarily stores complete samples (batch loading is faster)

    std::string filename = checkpoint_filename;
    std::string filename_old = checkpoint_filename + "_old";

    if (!filename.empty()){ // recover from an existing checkpoint
        std::ifstream infile(filename, std::ios::binary);
        try{ // attempt to recover from filename
            if (!infile.good()) throw std::runtime_error("missing main checkpoint");
            grid.read(infile, mode_binary);
            complete.read(infile);
        }catch(std::runtime_error &){
            // main file is missing or is corrupt, try the older version
            std::ifstream oldfile(filename_old, std::ios::binary);
            try{
                if (!oldfile.good()) throw std::runtime_error("missing main checkpoint");
                grid.read(oldfile, mode_binary);
                complete.read(oldfile);
            }catch(std::runtime_error &){
                // nothing could be recovered, start over from the current grid
            }
        }
    }

    if (!filename.empty()){ // initial checkpoint
        std::ofstream ofs(filename, std::ios::binary);
        grid.write(ofs, mode_binary); // write grid to current
        complete.write(ofs);
    }

    // prepare several commonly used steps
    auto checkpoint = [&]()->void{ // keeps two saved states for the constructed grid
        if (!filename.empty()){
            { // copy current into old and write to current
                std::ifstream current_state(filename, std::ios::binary);
                std::ofstream previous_state(filename, std::ios::binary);
                previous_state << current_state.rdbuf();
            }
            std::ofstream ofs(filename, std::ios::binary);
            grid.write(ofs, mode_binary); // write grid to current
            complete.write(ofs);
        }
    };

    auto load_complete = [&]()->void{ // loads any complete points, does nothing if getNumStored() is zero
        if (complete.getNumStored() > 0)
            complete.load(grid);
    };

    auto refresh_candidates = [&]()->void{ // loads complete and asks for new candidates
        load_complete(); // always load before computing new candidates
        manager = candidates(grid); // get new candidates
    };

    size_t total_num_launched = complete.getNumStored() + grid.getNumLoaded(); // count all launched jobs, including the ones already complete
    auto checkout_sample = [&]()->std::vector<double>{ // get the "most-important" point that has not started yet
        auto x = manager.next(max_num_points - total_num_launched);
        if (x.empty()){ // did not find a job, maybe we need to refresh the candidates
            refresh_candidates();
            x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted all possible candidates
        }
        return x;
    };

    // load the initial guess into y (is using initial guess), otherwise set y to the correct size
    auto set_initial_guess = [&](std::vector<double> const &x, std::vector<double> &y)->void{
        if (use_initial_guess){
            if (grid.getNumLoaded()) grid.evaluateBatch(x, y);
            else y.clear();
        }else{
            y.resize(num_outputs * (x.size() / num_dimensions));
        }
    };

    if (!grid.isUsingConstruction()) // the procedure assumes dynamic construction
        grid.beginConstruction();

    refresh_candidates();

    if (parallel_construction == mode_parallel){ // parallel version
        // allocate space for all x and y pairs, will be filled by workers and processed by main
        std::vector<std::vector<double>> x(num_parallel_jobs),
                                         y(num_parallel_jobs, std::vector<double>(max_samples_per_job * num_outputs));

        std::vector<int> work_flag(num_parallel_jobs);
        constexpr int flag_done = 0;
        constexpr int flag_computing = 1;
        constexpr int flag_shutdown = 2;

        std::condition_variable until_someone_done;
        std::condition_variable until_new_job;
        std::mutex access_count_done;
        int count_done = 0;

        // lambda that will handle the work
        auto do_work = [&](size_t thread_id)->void{

            int my_flag = flag_computing;
            while(my_flag == flag_computing){
                model(x[thread_id], y[thread_id], thread_id); // does the model evaluations

                { // must guarantee sync between work_flag and count_done, use a lock
                    std::lock_guard<std::mutex> lock(access_count_done);
                    work_flag[thread_id] = flag_done;
                    count_done++;
                }
                until_someone_done.notify_one(); // just finished some work, notify the main thread

                { // wait till the main thread gives us an new piece of work
                    std::unique_lock<std::mutex> lock(access_count_done);
                    until_new_job.wait(lock, [&]()->bool{ return (work_flag[thread_id] != flag_done); });
                    my_flag = work_flag[thread_id];
                }
            }
        };

        // launch initial set of jobs
        std::vector<std::thread> workers(num_parallel_jobs);
        for(size_t id=0; id<num_parallel_jobs; id++){
            x[id] = manager.next(max_num_points - total_num_launched);
            if (!x[id].empty()){
                total_num_launched += x[id].size() / num_dimensions;
                set_initial_guess(x[id], y[id]);
                work_flag[id] = flag_computing;
                workers[id] = std::thread(do_work, id);
            }else{
                work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
            }
        }

        auto collect_finished = [&]()->bool{
            bool any_done = false;
            for(size_t id=0; id<num_parallel_jobs; id++){
                if (work_flag[id] == flag_done){
                    if (!x.empty()){ // shouldn't be empty
                        complete.add(x[id], y[id]);
                        manager.complete(x[id]);
                        any_done = true;
                    }
                    if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                        load_complete(); // move from complete into the grid

                    if (total_num_launched < max_num_points){
                        // refresh the candidates if enough of the current candidates have completed
                        if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                            refresh_candidates();

                        x[id] = checkout_sample(); // if necessary this will call refresh_candidates()

                        if (!x[id].empty()){ // if empty, then we have finished all possible candidates (reached tolerance)
                            total_num_launched += x[id].size() / num_dimensions;
                            set_initial_guess(x[id], y[id]);
                            work_flag[id] = flag_computing;
                        }else{
                            work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
                        }
                    }else{
                        work_flag[id] = flag_shutdown; // reached the budget, shutdown the thread
                    }
                }
            }
            return any_done;
        };

        while(manager.getNumRunning() > 0){ // main loop
            {   // lock access to the count_done variable
                std::unique_lock<std::mutex> lock(access_count_done);
                // unlock and wait until some else increments the "done" count
                until_someone_done.wait(lock, [&]()->bool{ return (count_done > 0); });
                // the lock is back on at this point, process the completed samples, reset the count and go back to waiting
                count_done = 0;
                if (collect_finished()) checkpoint(); // if new samples were computed, save the state
            } // unlock the access_count_done and notify that we have loaded new jobs
            // without the unlock, the threads will wake up but will not be able to read the worker flags
            until_new_job.notify_all();
        }

        load_complete(); // flush completed jobs

        for(auto &w : workers) if (w.joinable()) w.join(); // join all threads

    }else{
        std::vector<double> x(grid.getNumDimensions()), y( grid.getNumOutputs());

        while((total_num_launched < max_num_points) && (manager.getNumCandidates() > 0)){
            x = manager.next(max_num_points - total_num_launched);
            if (x.empty()){ // need more candidates
                refresh_candidates();
                x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted the candidates
            }
            if (!x.empty()){ // could be empty if there are no more candidates
                total_num_launched += x.size() / num_dimensions;
                set_initial_guess(x, y);
                model(x, y, 0); // compute a sample
                complete.add(x, y);
                manager.complete(x);

                // the fist thousand points can be loaded one at a time, then add when % increase of the grid is achieved
                if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                    load_complete(); // also does checkpoint save
                // if done with the top % of the grid points, recompute the candidates
                if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                    refresh_candidates();
            }
            checkpoint();
        }

        load_complete(); // flush completed jobs
    }
}